

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

void * crnd::crnd_get_level_data(void *pData,uint32 data_size,uint32 level_index,uint32 *pSize)

{
  crn_header *pcVar1;
  uint uVar2;
  uint uVar3;
  
  if (pSize != (uint32 *)0x0) {
    *pSize = 0;
  }
  if (((0x3d < data_size && pData != (void *)0x0) &&
      (pcVar1 = crnd_get_header(pData,data_size), pcVar1 != (crn_header *)0x0)) &&
     (uVar3 = (uint)(pcVar1->m_levels).m_buf[0], level_index < uVar3)) {
    uVar2 = *(uint *)pcVar1->m_level_ofs[level_index].m_buf;
    uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    if (pSize != (uint32 *)0x0) {
      if (level_index + 1 < uVar3) {
        uVar3 = *(uint *)pcVar1->m_level_ofs[level_index + 1].m_buf;
        data_size = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      }
      *pSize = data_size - uVar2;
    }
    return (void *)((long)pData + (ulong)uVar2);
  }
  return (void *)0x0;
}

Assistant:

const void* crnd_get_level_data(const void* pData, uint32 data_size, uint32 level_index, uint32* pSize)
    {
        if (pSize)
            *pSize = 0;

        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return NULL;

        const crn_header* pHeader = crnd_get_header(pData, data_size);
        if (!pHeader)
            return NULL;

        if (level_index >= pHeader->m_levels)
            return NULL;

        uint32 cur_level_ofs = pHeader->m_level_ofs[level_index];

        if (pSize)
        {
            uint32 next_level_ofs = data_size;
            if ((level_index + 1) < (pHeader->m_levels))
                next_level_ofs = pHeader->m_level_ofs[level_index + 1];

            *pSize = next_level_ofs - cur_level_ofs;
        }

        return static_cast<const uint8*>(pData) + cur_level_ofs;
    }